

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void LargeIntRegMultiply<long,unsigned_long>::
     RegMultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (int64_t *a,uint64_t *b,int64_t *pRet)

{
  long lVar1;
  bool bVar2;
  int64_t iVar3;
  ulong uVar4;
  int64_t *in_RDX;
  long *in_RDI;
  int64_t a1;
  uint64_t tmp;
  bool aNegative;
  uint64_t *in_stack_ffffffffffffffa8;
  uint64_t *in_stack_ffffffffffffffb0;
  ulong uVar5;
  
  lVar1 = *in_RDI;
  if (lVar1 < 0) {
    AbsValueHelper<long,_1>::Abs(0x20d6f5);
  }
  bVar2 = LargeIntRegMultiply<unsigned_long,_unsigned_long>::RegMultiply
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(uint64_t *)0x20d725);
  if (bVar2) {
    if (lVar1 < 0) {
      std::numeric_limits<long>::min();
      iVar3 = SignedNegation<long>::Value(0);
      *in_RDX = iVar3;
    }
    else {
      uVar5 = 0;
      uVar4 = std::numeric_limits<long>::max();
      if (uVar4 < uVar5) goto LAB_0020d796;
      *in_RDX = 0;
    }
    return;
  }
LAB_0020d796:
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14_MULTIPLY static void RegMultiplyThrow( const std::int64_t& a, const std::uint64_t& b, std::int64_t* pRet ) SAFEINT_CPP_THROW
    {
        bool aNegative = false;
        std::uint64_t tmp = 0;
        std::int64_t a1 = a;

        if( a1 < 0 )
        {
            aNegative = true;
            a1 = (std::int64_t)AbsValueHelper< std::int64_t, GetAbsMethod< std::int64_t >::method >::Abs(a1);
        }

        if( LargeIntRegMultiply< std::uint64_t, std::uint64_t >::RegMultiply( (std::uint64_t)a1, (std::uint64_t)b, &tmp ) )
        {
            // The unsigned multiplication didn't overflow
            if( aNegative )
            {
                // Result must be negative
                if( tmp <= (std::uint64_t)std::numeric_limits< std::int64_t >::min() )
                {
                    *pRet = SignedNegation< std::int64_t >::Value( tmp );
                    return;
                }
            }
            else
            {
                // Result must be positive
                if( tmp <= (std::uint64_t)std::numeric_limits<std::int64_t>::max() )
                {
                    *pRet = (std::int64_t)tmp;
                    return;
                }
            }
        }

        E::SafeIntOnOverflow();
    }